

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall google::protobuf::DescriptorPool::Tables::AddFile(Tables *this,FileDescriptor *file)

{
  pair<std::tr1::__detail::_Hashtable_iterator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false,_false>,_bool>
  ret;
  char *local_48 [2];
  char local_38;
  undefined8 local_30;
  FileDescriptor *local_28;
  
  local_30 = **(undefined8 **)file;
  local_28 = file;
  std::tr1::
  _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  ::_M_insert(local_48,(_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                        *)&this->files_by_name_);
  if (local_38 == '\x01') {
    local_48[0] = (char *)**(undefined8 **)file;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->files_after_checkpoint_,
               local_48);
  }
  return (bool)local_38;
}

Assistant:

bool DescriptorPool::Tables::AddFile(const FileDescriptor* file) {
  if (InsertIfNotPresent(&files_by_name_, file->name().c_str(), file)) {
    files_after_checkpoint_.push_back(file->name().c_str());
    return true;
  } else {
    return false;
  }
}